

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

void __thiscall diy::Master::QueueRecord::QueueRecord(QueueRecord *this,MemoryBuffer *b)

{
  pointer pcVar1;
  pointer pBVar2;
  
  (this->buffer_).super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_0014e178;
  (this->buffer_).position = b->position;
  pcVar1 = (b->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->buffer_).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->buffer_).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar1;
  (this->buffer_).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (b->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (b->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (b->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buffer_).blob_position = b->blob_position;
  pBVar2 = (b->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->buffer_).blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (b->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->buffer_).blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_finish = pBVar2;
  (this->buffer_).blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (b->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (b->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->size_ = (long)(this->buffer_).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(this->buffer_).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                      .super__Vector_impl_data._M_start;
  this->external_ = -1;
  return;
}

Assistant:

MemoryBuffer(MemoryBuffer&&)                =default;